

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::erase
          (Data<QHashPrivate::Node<QString,_QConfFile_*>_> *this,Bucket bucket)

{
  byte bVar1;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pSVar2;
  size_t sVar3;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pSVar4;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pSVar5;
  size_t bucket_00;
  ulong uVar6;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *fromSpan;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *this_00;
  size_t fromIndex;
  QStringView key;
  
  bucket_00 = bucket.index;
  fromSpan = bucket.span;
  Span<QHashPrivate::Node<QString,_QConfFile_*>_>::erase
            ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)fromSpan,bucket_00);
  *(long *)(this + 8) = *(long *)(this + 8) + -1;
  this_00 = fromSpan;
  fromIndex = bucket_00;
  do {
    pSVar2 = *(Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> **)(this + 0x20);
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      fromSpan = fromSpan + 1;
      if (((long)fromSpan - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 -
          (*(ulong *)(this + 0x10) >> 7) == 0) {
        fromSpan = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = fromSpan->offsets[fromIndex];
    if (bVar1 != 0xff) {
      key.m_data = *(storage_type_conflict **)
                    ((fromSpan->entries->storage).data + (ulong)bVar1 * 0x20 + 8);
      key.m_size = *(qsizetype *)((fromSpan->entries->storage).data + (ulong)bVar1 * 0x20 + 0x10);
      sVar3 = ::qHash(key,*(size_t *)(this + 0x18));
      uVar6 = *(ulong *)(this + 0x10) - 1 & sVar3;
      pSVar4 = pSVar2 + (uVar6 >> 7);
      uVar6 = (ulong)((uint)uVar6 & 0x7f);
      if (uVar6 != fromIndex || pSVar4 != fromSpan) {
        do {
          if ((pSVar4 == this_00) && (uVar6 == bucket_00)) {
            if (fromSpan == this_00) {
              this_00->offsets[bucket_00] = this_00->offsets[fromIndex];
              this_00->offsets[fromIndex] = 0xff;
              bucket_00 = fromIndex;
              this_00 = fromSpan;
            }
            else {
              Span<QHashPrivate::Node<QString,_QConfFile_*>_>::moveFromSpan
                        ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)this_00,fromSpan,
                         fromIndex,bucket_00);
              bucket_00 = fromIndex;
              this_00 = fromSpan;
            }
            break;
          }
          uVar6 = uVar6 + 1;
          if (uVar6 == 0x80) {
            pSVar5 = pSVar4 + 1;
            pSVar4 = pSVar2;
            if (((long)pSVar5 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 -
                (*(ulong *)(this + 0x10) >> 7) != 0) {
              pSVar4 = pSVar5;
            }
            uVar6 = 0;
          }
        } while ((pSVar4 != fromSpan) || (uVar6 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }